

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

int __thiscall deqp::egl::ResizeTests::init(ResizeTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  int iVar2;
  TestCaseGroup *pTVar3;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"surface_size",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"EGL surface size update",&local_52);
  pTVar3 = createCaseGroup<deqp::egl::ChangeSurfaceSizeCase>(pEVar1,&local_30,&local_50);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"back_buffer",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Back buffer contents",&local_52);
  pTVar3 = createCaseGroup<deqp::egl::PreserveBackBufferCase>(pEVar1,&local_30,&local_50);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"pixel_density",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Pixel density",&local_52);
  pTVar3 = createCaseGroup<deqp::egl::UpdateResolutionCase>(pEVar1,&local_30,&local_50);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = std::__cxx11::string::~string((string *)&local_30);
  return iVar2;
}

Assistant:

void ResizeTests::init (void)
{
	addChild(createCaseGroup<ChangeSurfaceSizeCase>(m_eglTestCtx,
													"surface_size",
													"EGL surface size update"));
	addChild(createCaseGroup<PreserveBackBufferCase>(m_eglTestCtx,
													 "back_buffer",
													 "Back buffer contents"));
	addChild(createCaseGroup<UpdateResolutionCase>(m_eglTestCtx,
												   "pixel_density",
												   "Pixel density"));
}